

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::emit_entry_point_declarations(CompilerMSL *this)

{
  _Rb_tree_header *p_Var1;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  SPIRVariable **ppSVar2;
  ID *__k;
  int iVar3;
  MSLSamplerAddress MVar4;
  size_t sVar5;
  uint *puVar6;
  bool bVar7;
  int iVar8;
  MSLSamplerAddress addr;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  uint uVar12;
  SPIRVariable *pSVar13;
  SPIRType *pSVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  SPIRType *pSVar17;
  SPIRType *type;
  size_t *extraout_RAX;
  size_t *psVar18;
  mapped_type *pmVar19;
  runtime_error *prVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  long lVar23;
  CompilerMSL *pCVar24;
  _Alloc_hider _Var25;
  string *in_R8;
  char *in_R9;
  string *ts_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  pair<unsigned_int,_unsigned_int> *ppVar27;
  SPIRVariable **ppSVar28;
  char (*in_stack_ffffffffffffec38) [2];
  string alias_name;
  string local_1390;
  _Base_ptr local_1370;
  char *local_1368;
  uint32_t base_index;
  char *desc_addr_space;
  char local_1348 [16];
  _Base_ptr local_1338;
  char *local_1330;
  uint32_t desc_set;
  undefined4 uStack_1324;
  char local_1318 [16];
  char *local_1308;
  uint32_t desc_binding;
  char acStack_12fc [12];
  undefined1 local_12f0 [16];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  string local_11a8;
  string local_1188;
  string local_1168;
  string local_1148;
  string name;
  
  declare_complex_constant_arrays(this);
  p_Var15 = (this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->constexpr_samplers_by_id)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var15 != p_Var1) {
    do {
      paVar21 = &name.field_2;
      pSVar13 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + p_Var15[1]._M_color);
      pSVar14 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar13->super_IVariant).field_0xc);
      if (pSVar14->basetype == Sampler) {
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,p_Var15[1]._M_color);
      }
      args.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size = 0;
      args.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &args.stack_storage;
      args.buffer_capacity = 8;
      if (*(int *)&p_Var15[1].field_0x4 != 0) {
        name._M_dataplus._M_p = (pointer)paVar21;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&name,"coord::pixel","");
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name
                   );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != paVar21) {
          operator_delete(name._M_dataplus._M_p);
        }
      }
      iVar3 = *(int *)&p_Var15[1]._M_parent;
      iVar8 = *(int *)((long)&p_Var15[1]._M_parent + 4);
      if (iVar3 == iVar8) {
        if (iVar3 != 0) {
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&name,"filter::linear","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
joined_r0x0026d092:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != paVar21) {
            operator_delete(name._M_dataplus._M_p);
          }
        }
      }
      else {
        if (iVar3 != 0) {
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&name,"min_filter::linear","")
          ;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != paVar21) {
            operator_delete(name._M_dataplus._M_p);
          }
          iVar8 = *(int *)((long)&p_Var15[1]._M_parent + 4);
        }
        if (iVar8 != 0) {
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&name,"mag_filter::linear","")
          ;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          goto joined_r0x0026d092;
        }
      }
      iVar3 = *(int *)&p_Var15[1]._M_left;
      if (iVar3 != 0) {
        if (iVar3 == 2) {
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&name,"mip_filter::linear","")
          ;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
        }
        else {
          if (iVar3 != 1) {
            prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar20,"Invalid mip filter.");
            goto LAB_0026ec9b;
          }
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"mip_filter::nearest","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != paVar21) {
          operator_delete(name._M_dataplus._M_p);
        }
      }
      MVar4 = *(MSLSamplerAddress *)((long)&p_Var15[1]._M_left + 4);
      addr = *(MSLSamplerAddress *)&p_Var15[1]._M_right;
      if ((MVar4 == addr) && (MVar4 == *(MSLSamplerAddress *)((long)&p_Var15[1]._M_right + 4))) {
        if (MVar4 != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
          create_sampler_address_abi_cxx11_(&name,"",MVar4);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
joined_r0x0026d225:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != paVar21) {
            operator_delete(name._M_dataplus._M_p);
          }
        }
      }
      else {
        if (MVar4 != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
          create_sampler_address_abi_cxx11_(&name,"s_",MVar4);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != paVar21) {
            operator_delete(name._M_dataplus._M_p);
          }
          addr = *(MSLSamplerAddress *)&p_Var15[1]._M_right;
        }
        if (addr != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
          create_sampler_address_abi_cxx11_(&name,"t_",addr);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != paVar21) {
            operator_delete(name._M_dataplus._M_p);
          }
        }
        MVar4 = *(MSLSamplerAddress *)((long)&p_Var15[1]._M_right + 4);
        if (MVar4 != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE) {
          create_sampler_address_abi_cxx11_(&name,"r_",MVar4);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          goto joined_r0x0026d225;
        }
      }
      if (p_Var15[4].field_0x4 == '\x01') {
        switch(p_Var15[2]._M_color) {
        case _S_red:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"compare_func::never","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        case _S_black:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&name,"compare_func::less","")
          ;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        case 2:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"compare_func::less_equal","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        case 3:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"compare_func::greater","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        case 4:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"compare_func::greater_equal","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        case 5:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"compare_func::equal","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        case 6:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"compare_func::not_equal","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        case 7:
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"compare_func::always","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
          break;
        default:
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar20,"Invalid sampler compare function.");
          goto LAB_0026ec9b;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != paVar21) {
          operator_delete(name._M_dataplus._M_p);
        }
      }
      if (((*(int *)((long)&p_Var15[1]._M_left + 4) == 2) || (*(int *)&p_Var15[1]._M_right == 2)) ||
         (*(int *)((long)&p_Var15[1]._M_right + 4) == 2)) {
        iVar3 = *(int *)&p_Var15[2].field_0x4;
        if (iVar3 == 0) {
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"border_color::transparent_black","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
        }
        else if (iVar3 == 2) {
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"border_color::opaque_white","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
        }
        else {
          if (iVar3 != 1) {
            prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(prVar20,"Invalid sampler border color.");
LAB_0026ec9b:
            *(undefined ***)prVar20 = &PTR__runtime_error_004faf50;
            __cxa_throw(prVar20,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          name._M_dataplus._M_p = (pointer)paVar21;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&name,"border_color::opaque_black","");
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != paVar21) {
          operator_delete(name._M_dataplus._M_p);
        }
      }
      if (p_Var15[4].field_0x6 == '\x01') {
        join<char_const(&)[16],int&,char_const(&)[2]>
                  (&name,(spirv_cross *)"max_anisotropy(",(char (*) [16])&p_Var15[2]._M_left,
                   (int *)0x406dab,(char (*) [2])in_R8);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name
                   );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != paVar21) {
          operator_delete(name._M_dataplus._M_p);
        }
      }
      if (p_Var15[4].field_0x5 == '\x01') {
        CompilerGLSL::format_float_abi_cxx11_
                  (&alias_name,&this->super_CompilerGLSL,*(float *)&p_Var15[2]._M_parent);
        in_R8 = &local_1390;
        CompilerGLSL::format_float_abi_cxx11_
                  (in_R8,&this->super_CompilerGLSL,*(float *)((long)&p_Var15[2]._M_parent + 4));
        in_R9 = ")";
        join<char_const(&)[11],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                  (&name,(spirv_cross *)0x3f8246,(char (*) [11])&alias_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f8185,
                   (char (*) [3])in_R8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x406dab,
                   in_stack_ffffffffffffec38);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&args,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name
                   );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != paVar21) {
          operator_delete(name._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
          operator_delete(local_1390._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
          operator_delete(alias_name._M_dataplus._M_p);
        }
      }
      if (args.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size == 0) {
        if (pSVar14->basetype == SampledImage) {
          to_sampler_expression_abi_cxx11_(&name,this,p_Var15[1]._M_color);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    ((StringStream<4096UL,_4096UL> *)&name,this,(ulong)p_Var15[1]._M_color,1);
        }
        CompilerGLSL::statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&name,
                   (char (*) [2])0x405f81);
        _Var25 = name._M_dataplus;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != paVar21) goto LAB_0026d7e1;
      }
      else {
        if (pSVar14->basetype == SampledImage) {
          to_sampler_expression_abi_cxx11_(&alias_name,this,p_Var15[1]._M_color);
        }
        else {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&alias_name,this,(ulong)p_Var15[1]._M_color,1);
        }
        name.field_2._M_allocated_capacity = 0;
        name._M_dataplus._M_p = (pointer)0x0;
        name._M_string_length = 0;
        StringStream<4096UL,_4096UL>::reset((StringStream<4096UL,_4096UL> *)&name);
        if (args.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .buffer_size != 0) {
          pbVar26 = args.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr + args.
                           super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .buffer_size;
          pbVar22 = args.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr;
          do {
            StringStream<4096UL,_4096UL>::append
                      ((StringStream<4096UL,_4096UL> *)&name,(pbVar22->_M_dataplus)._M_p,
                       pbVar22->_M_string_length);
            if (pbVar22 !=
                args.
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .ptr + (args.
                        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .buffer_size - 1)) {
              StringStream<4096UL,_4096UL>::append((StringStream<4096UL,_4096UL> *)&name,", ",2);
            }
            pbVar22 = pbVar22 + 1;
          } while (pbVar22 != pbVar26);
        }
        in_R8 = &local_1390;
        StringStream<4096ul,4096ul>::str_abi_cxx11_(in_R8,(StringStream<4096UL,_4096UL> *)&name);
        StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)&name);
        in_R9 = ");";
        CompilerGLSL::
        statement<char_const(&)[19],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
                  (&this->super_CompilerGLSL,(char (*) [19])"constexpr sampler ",&alias_name,
                   (char (*) [2])0x3fb721,in_R8,(char (*) [3])0x405f80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
          operator_delete(local_1390._M_dataplus._M_p);
        }
        _Var25._M_p = alias_name._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
LAB_0026d7e1:
          operator_delete(_Var25._M_p);
        }
      }
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector(&args);
      p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15);
    } while ((_Rb_tree_header *)p_Var15 != p_Var1);
  }
  p_Var15 = (this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  local_1338 = &(this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header.
                _M_header;
  if (p_Var15 != local_1338) {
    do {
      uVar16 = (ulong)*(uint *)((long)&p_Var15[1]._M_parent + 4);
      if (uVar16 != 0) {
        local_1370 = p_Var15;
        pSVar13 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + uVar16);
        uVar12 = (pSVar13->super_IVariant).self.id;
        pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar13);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&name,this,(ulong)(pSVar13->super_IVariant).self.id,1);
        uVar9 = Compiler::get_decoration
                          ((Compiler *)this,(ID)(pSVar13->super_IVariant).self.id,
                           DecorationDescriptorSet);
        uVar9 = this->argument_buffer_ids[uVar9];
        base_index = *(uint32_t *)&local_1370[1]._M_parent;
        bVar7 = Compiler::is_array((Compiler *)this,pSVar14);
        if (bVar7) {
          this->is_using_builtin_array = true;
          pSVar17 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar13->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_
                    ((string *)&args,this,pSVar17,(pSVar13->super_IVariant).self.id,true);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&alias_name,this,pSVar14,0);
          desc_addr_space = to_restrict(this,uVar12,true);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                    (&local_1390,this,pSVar14,(ulong)uVar12);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string&,std::__cxx11::string,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [2])0x3c91f1,&alias_name,(char (*) [3])0x3f76d1,&desc_addr_space,
                     &name,&local_1390,(char (*) [3])0x3ed5a5);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
            operator_delete(local_1390._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
            operator_delete(alias_name._M_dataplus._M_p);
          }
          if (args.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &args.buffer_capacity) {
            operator_delete(args.
                            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .ptr);
          }
          uVar10 = get_resource_array_size(this,pSVar14,uVar12);
          if (uVar10 == 0) {
            prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error
                      (prVar20,
                       "Size of runtime array with dynamic offset could not be determined from resource bindings."
                      );
            *(undefined ***)prVar20 = &PTR__runtime_error_004faf50;
            __cxa_throw(prVar20,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
          }
          CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
          local_1368 = (char *)((ulong)local_1368 & 0xffffffff00000000);
          do {
            pSVar17 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(pSVar13->super_IVariant).field_0xc);
            get_type_address_space_abi_cxx11_
                      ((string *)&args,this,pSVar17,(pSVar13->super_IVariant).self.id,true);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&alias_name,this,pSVar14,0);
            local_11c8._M_dataplus._M_p = to_restrict(this,uVar12,false);
            pSVar17 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 *(uint *)&(pSVar13->super_IVariant).field_0xc);
            get_type_address_space_abi_cxx11_
                      (&local_1390,this,pSVar17,(pSVar13->super_IVariant).self.id,true);
            local_1308 = to_restrict(this,uVar12,false);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (&desc_addr_space,this,uVar9,1);
            local_1188._M_dataplus._M_p = (pointer)&local_1188.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1188,name._M_dataplus._M_p,
                       name._M_dataplus._M_p + name._M_string_length);
            local_1148._M_dataplus._M_p = (pointer)&local_1148.field_2;
            pCVar24 = (CompilerMSL *)0x3dcbc2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1148,"m","");
            ensure_valid_name((string *)&desc_set,pCVar24,&local_1188,&local_1148);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &desc_binding,this,(ulong)this->dynamic_offsets_buffer_id,1);
            local_1330 = (char *)CONCAT44(local_1330._4_4_,(int)local_1368 + base_index);
            in_R9 = "* ";
            CompilerGLSL::
            statement<char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int,char_const(&)[4]>
                      (&this->super_CompilerGLSL,(char (*) [2])0x3fb721,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                       (char (*) [2])0x3c91f1,&alias_name,(char (*) [3])0x3f76d1,
                       (char **)&local_11c8,(char (*) [4])")((",&local_1390,(char (*) [8])" char* ",
                       &local_1308,(char (*) [2])0x406dab,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &desc_addr_space,(char (*) [2])0x3af3bf,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &desc_set,(char (*) [2])0x3a6838,(uint *)&local_1368,(char (*) [2])0x3e6f45,
                       (char (*) [4])0x3ef36f,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &desc_binding,(char (*) [2])0x3a6838,(uint *)&local_1330,(char (*) [4])"]),")
            ;
            if ((undefined1 *)CONCAT44(acStack_12fc._0_4_,desc_binding) != local_12f0) {
              operator_delete((undefined1 *)CONCAT44(acStack_12fc._0_4_,desc_binding));
            }
            if (_desc_set != local_1318) {
              operator_delete(_desc_set);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
              operator_delete(local_1148._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1188._M_dataplus._M_p != &local_1188.field_2) {
              operator_delete(local_1188._M_dataplus._M_p);
            }
            if (desc_addr_space != local_1348) {
              operator_delete(desc_addr_space);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
              operator_delete(local_1390._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
              operator_delete(alias_name._M_dataplus._M_p);
            }
            if (args.
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &args.buffer_capacity) {
              operator_delete(args.
                              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .ptr);
            }
            uVar11 = (int)local_1368 + 1;
            local_1368 = (char *)CONCAT44(local_1368._4_4_,uVar11);
          } while (uVar11 < uVar10);
          CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
          uVar9 = (this->super_CompilerGLSL).indent;
          (this->super_CompilerGLSL).indent = 0;
          CompilerGLSL::statement<char_const(&)[1]>
                    (&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
          (this->super_CompilerGLSL).indent = uVar9;
          this->is_using_builtin_array = false;
        }
        else {
          pSVar17 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar13->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_
                    ((string *)&args,this,pSVar17,(pSVar13->super_IVariant).self.id,true);
          local_1308 = to_restrict(this,uVar12,true);
          pSVar17 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar13->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_
                    (&alias_name,this,pSVar17,(pSVar13->super_IVariant).self.id,true);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_1390,this,pSVar14,0);
          local_1368 = to_restrict(this,uVar12,false);
          pSVar14 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar13->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_
                    ((string *)&desc_addr_space,this,pSVar14,(pSVar13->super_IVariant).self.id,true)
          ;
          local_1330 = to_restrict(this,uVar12,false);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&desc_set,this,uVar9,1);
          local_11a8._M_dataplus._M_p = (pointer)&local_11a8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_11a8,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          local_1168._M_dataplus._M_p = (pointer)&local_1168.field_2;
          pCVar24 = (CompilerMSL *)0x3dcbc2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1168,"m","");
          ensure_valid_name((string *)&desc_binding,pCVar24,&local_11a8,&local_1168);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_11c8,this,(ulong)this->dynamic_offsets_buffer_id,1);
          in_R9 = " = *(";
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,char_const(&)[4],std::__cxx11::string,char_const(&)[8],char_const*,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [8])" auto& ",&local_1308,&name,(char (*) [6])" = *(",&alias_name,
                     (char (*) [2])0x3c91f1,&local_1390,(char (*) [3])0x3f76d1,&local_1368,
                     (char (*) [4])")((",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &desc_addr_space,(char (*) [8])" char* ",&local_1330,(char (*) [2])0x406dab,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_set,
                     (char (*) [2])0x3af3bf,(string *)&desc_binding,(char (*) [4])0x3ef36f,
                     &local_11c8,(char (*) [2])0x3a6838,&base_index,(char (*) [4])0x3e5bc0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_11c8._M_dataplus._M_p != &local_11c8.field_2) {
            operator_delete(local_11c8._M_dataplus._M_p);
          }
          if ((undefined1 *)CONCAT44(acStack_12fc._0_4_,desc_binding) != local_12f0) {
            operator_delete((undefined1 *)CONCAT44(acStack_12fc._0_4_,desc_binding));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1168._M_dataplus._M_p != &local_1168.field_2) {
            operator_delete(local_1168._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_11a8._M_dataplus._M_p != &local_11a8.field_2) {
            operator_delete(local_11a8._M_dataplus._M_p);
          }
          if (_desc_set != local_1318) {
            operator_delete(_desc_set);
          }
          if (desc_addr_space != local_1348) {
            operator_delete(desc_addr_space);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
            operator_delete(local_1390._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
            operator_delete(alias_name._M_dataplus._M_p);
          }
          if (args.
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &args.buffer_capacity) {
            operator_delete(args.
                            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .ptr);
          }
        }
        p_Var15 = local_1370;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p);
          p_Var15 = local_1370;
        }
      }
      p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != local_1338);
  }
  sVar5 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.buffer_size;
  if (sVar5 != 0) {
    ppSVar28 = (this->entry_point_bindings).super_VectorView<spirv_cross::SPIRVariable_*>.ptr;
    ppSVar2 = ppSVar28 + sVar5;
    local_1338 = (_Base_ptr)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
    local_1370 = (_Base_ptr)((ulong)local_1370 & 0xffffffff00000000);
    do {
      ts_4 = &local_1390;
      pSVar13 = *ppSVar28;
      pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar13);
      pSVar17 = Compiler::get_variable_element_type((Compiler *)this,pSVar13);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&name,this,(ulong)(pSVar13->super_IVariant).self.id,1);
      bVar7 = is_var_runtime_size_array(this,pSVar13);
      __k = &(pSVar13->super_IVariant).self;
      if (bVar7) {
        if ((int)(this->msl_options).argument_buffers_tier < 1) {
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error
                    (prVar20,"Unsized array of descriptors requires argument buffer tier 2");
          *(undefined ***)prVar20 = &PTR__runtime_error_004faf50;
          __cxa_throw(prVar20,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &args.buffer_capacity;
        args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .buffer_size = 0;
        args.buffer_capacity = args.buffer_capacity & 0xffffffffffffff00;
        uVar9 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationDescriptorSet);
        if (((uVar9 < 8) && ((this->msl_options).argument_buffers != false)) &&
           ((this->argument_buffer_discrete_mask >> (uVar9 & 0x1f) & 1) == 0)) {
          ::std::__detail::
          _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)local_1338,__k);
          ::std::__cxx11::string::_M_assign((string *)&args);
        }
        else {
          alias_name._M_dataplus._M_p = (pointer)&alias_name.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&alias_name,name._M_dataplus._M_p,
                     name._M_dataplus._M_p + name._M_string_length);
          ::std::__cxx11::string::append((char *)&alias_name);
          ::std::__cxx11::string::operator=((string *)&args,(string *)&alias_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
            operator_delete(alias_name._M_dataplus._M_p);
          }
        }
        switch(pSVar14->basetype) {
        case Struct:
          pSVar14 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr +
                               *(uint *)&(pSVar13->super_IVariant).field_0xc);
          get_type_address_space_abi_cxx11_(&alias_name,this,pSVar14,__k->id,true);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_1390,this,pSVar17,0);
          in_R9 = "*> ";
          CompilerGLSL::
          statement<char_const(&)[20],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&alias_name,
                     (char (*) [2])0x3c91f1,&local_1390,(char (*) [4])"*> ",&name,
                     (char (*) [3])0x3e8477,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [3])0x3efb99);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
            operator_delete(local_1390._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
LAB_0026e570:
            operator_delete(alias_name._M_dataplus._M_p);
          }
          break;
        case Image:
        case Sampler:
        case AccelerationStructure:
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&alias_name,this,pSVar17,(ulong)__k->id);
          in_R9 = " {";
          CompilerGLSL::
          statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&alias_name,
                     (char (*) [3])0x405f38,&name,(char (*) [3])0x3e8477,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [3])0x3efb99);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alias_name._M_dataplus._M_p != &alias_name.field_2) goto LAB_0026e570;
          break;
        case SampledImage:
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&alias_name,this,pSVar17,(ulong)__k->id);
          CompilerGLSL::
          statement<char_const(&)[20],std::__cxx11::string,char_const(&)[3],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&this->super_CompilerGLSL,(char (*) [20])"spvDescriptorArray<",&alias_name,
                     (char (*) [3])0x405f38,&name,(char (*) [3])0x3e8477,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                     (char (*) [3])0x3efb99);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
            operator_delete(alias_name._M_dataplus._M_p);
          }
          in_R9 = "Smplr_};";
          CompilerGLSL::
          statement<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[8],std::__cxx11::string_const&,char_const(&)[9]>
                    (&this->super_CompilerGLSL,(char (*) [29])"spvDescriptorArray<sampler> ",&name,
                     (char (*) [8])"Smplr {",&name,(char (*) [9])"Smplr_};");
        }
        psVar18 = &args.buffer_capacity;
        if (args.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar18) {
          operator_delete(args.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .ptr);
          psVar18 = extraout_RAX;
        }
        local_1370 = (_Base_ptr)
                     CONCAT44(local_1370._4_4_,(int)CONCAT71((int7)((ulong)psVar18 >> 8),1));
      }
      else if (((pSVar14->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
              (pSVar14->basetype == Struct)) {
        type = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar13->super_IVariant).field_0xc);
        get_type_address_space_abi_cxx11_((string *)&args,this,type,__k->id,true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&alias_name,this,pSVar17,0);
        local_1390._M_dataplus._M_p = to_restrict(this,__k->id,true);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*,std::__cxx11::string_const&,char_const(&)[5]>
                  (&this->super_CompilerGLSL,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [2])0x3c91f1,&alias_name,(char (*) [3])0x3f76d1,(char **)ts_4,&name,
                   (char (*) [5])"[] =");
        in_R9 = (char *)ts_4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
          operator_delete(alias_name._M_dataplus._M_p);
          in_R9 = (char *)ts_4;
        }
        if (args.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &args.buffer_capacity) {
          operator_delete(args.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .ptr);
        }
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        uVar9 = get_resource_array_size(this,pSVar14,__k->id);
        args.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)args.
                       super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .ptr & 0xffffffff00000000);
        if (uVar9 != 0) {
          do {
            CompilerGLSL::
            statement<std::__cxx11::string_const&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,&name,(char (*) [2])0x3e75a6,(uint *)&args,
                       (char (*) [2])0x3ed510);
            uVar12 = (int)args.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .ptr + 1;
            args.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(args.
                            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .ptr._4_4_,uVar12);
          } while (uVar12 < uVar9);
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        uVar9 = (this->super_CompilerGLSL).indent;
        (this->super_CompilerGLSL).indent = 0;
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
        (this->super_CompilerGLSL).indent = uVar9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
      ppSVar28 = ppSVar28 + 1;
    } while (ppSVar28 != ppSVar2);
    if (((ulong)local_1370 & 1) != 0) {
      uVar9 = (this->super_CompilerGLSL).indent;
      (this->super_CompilerGLSL).indent = 0;
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x3dee59);
      (this->super_CompilerGLSL).indent = uVar9;
    }
  }
  sVar5 = (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size;
  if (sVar5 != 0) {
    puVar6 = (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.ptr;
    lVar23 = 0;
    do {
      pSVar13 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)((long)puVar6 + lVar23));
      pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar13);
      pSVar17 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar13->super_IVariant).field_0xc);
      get_type_address_space_abi_cxx11_(&name,this,pSVar17,(pSVar13->super_IVariant).self.id,true);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (&args,this,(ulong)*(uint *)((long)puVar6 + lVar23),1);
      uVar9 = Compiler::get_decoration
                        ((Compiler *)this,(ID)*(uint32_t *)((long)puVar6 + lVar23),
                         DecorationDescriptorSet);
      desc_set = uVar9;
      desc_binding = Compiler::get_decoration
                               ((Compiler *)this,(ID)*(uint32_t *)((long)puVar6 + lVar23),Binding);
      join<char_const(&)[18],unsigned_int&,char_const(&)[8],unsigned_int&>
                (&alias_name,(spirv_cross *)"spvBufferAliasSet",(char (*) [18])&desc_set,
                 (uint *)"Binding",(char (*) [8])&desc_binding,(uint *)in_R9);
      desc_addr_space = to_restrict(this,*(uint32_t *)((long)puVar6 + lVar23),true);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_1390,this,pSVar14,0);
      in_R9 = " = *(";
      CompilerGLSL::
      statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,&name,(char (*) [8])" auto& ",&desc_addr_space,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                 (char (*) [6])" = *(",&name,(char (*) [2])0x3c91f1,&local_1390,
                 (char (*) [3])0x404eb1,&alias_name,(char (*) [2])0x405f81);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
        operator_delete(local_1390._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
        operator_delete(alias_name._M_dataplus._M_p);
      }
      if (args.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &args.buffer_capacity) {
        operator_delete(args.
                        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .ptr);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
      lVar23 = lVar23 + 4;
    } while (sVar5 << 2 != lVar23);
  }
  (this->buffer_aliases_discrete).super_VectorView<unsigned_int>.buffer_size = 0;
  sVar5 = (this->buffer_aliases_argument).super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.
          buffer_size;
  if (sVar5 != 0) {
    ppVar27 = (this->buffer_aliases_argument).
              super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr;
    local_1370 = (_Base_ptr)(ppVar27 + sVar5);
    this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
    do {
      uVar12 = ppVar27->first;
      uVar16 = (ulong)uVar12;
      uVar11 = ppVar27->second;
      pSVar13 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar16);
      pSVar14 = Compiler::get_variable_data_type((Compiler *)this,pSVar13);
      pSVar17 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           *(uint *)&(pSVar13->super_IVariant).field_0xc);
      get_type_address_space_abi_cxx11_(&name,this,pSVar17,(pSVar13->super_IVariant).self.id,true);
      if ((pSVar14->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        local_1390._M_dataplus._M_p = to_restrict(this,uVar12,true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&args,this,uVar16,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&alias_name,this,pSVar14,0);
        desc_addr_space = (char *)CONCAT44(desc_addr_space._4_4_,uVar11);
        pmVar19 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)&desc_addr_space);
        CompilerGLSL::
        statement<std::__cxx11::string&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&name,(char (*) [8])" auto& ",(char **)&local_1390,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [5])0x3f85d9,&name,(char (*) [2])0x3c91f1,&alias_name,
                   (char (*) [3])0x3b632c,&(pmVar19->decoration).qualified_alias,
                   (char (*) [2])0x405f81);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
          operator_delete(alias_name._M_dataplus._M_p);
        }
        if (args.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &args.buffer_capacity) {
          operator_delete(args.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .ptr);
        }
      }
      else {
        desc_addr_space = descriptor_address_space(this,uVar12,pSVar13->storage,"thread");
        this->is_using_builtin_array = true;
        _desc_set = to_restrict(this,uVar12,true);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&args,this,uVar16,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&alias_name,this,pSVar14,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])
                  (&local_1390,this,pSVar14,uVar16);
        desc_binding = uVar11;
        pmVar19 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,(key_type *)&desc_binding);
        CompilerGLSL::
        statement<char_const*&,char_const(&)[8],char_const*,std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],char_const*&,char_const(&)[5],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&desc_addr_space,(char (*) [8])" auto& ",
                   (char **)&desc_set,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args,
                   (char (*) [5])0x3f85d9,&name,(char (*) [2])0x3c91f1,&alias_name,
                   (char (*) [3])0x3f76d1,&desc_addr_space,(char (*) [5])" (&)",&local_1390,
                   (char (*) [2])0x406dab,&(pmVar19->decoration).qualified_alias,
                   (char (*) [2])0x405f81);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
          operator_delete(local_1390._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)alias_name._M_dataplus._M_p != &alias_name.field_2) {
          operator_delete(alias_name._M_dataplus._M_p);
        }
        if (args.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &args.buffer_capacity) {
          operator_delete(args.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .ptr);
        }
        this->is_using_builtin_array = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p);
      }
      ppVar27 = ppVar27 + 1;
    } while ((_Base_ptr)ppVar27 != local_1370);
  }
  uVar16 = (this->disabled_frag_outputs).super_VectorView<unsigned_int>.buffer_size;
  if (uVar16 != 0) {
    puVar6 = (this->disabled_frag_outputs).super_VectorView<unsigned_int>.ptr;
    lVar23 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    ::std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar6,puVar6 + uVar16,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
    ::std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar6,puVar6 + uVar16);
    sVar5 = (this->disabled_frag_outputs).super_VectorView<unsigned_int>.buffer_size;
    if (sVar5 != 0) {
      puVar6 = (this->disabled_frag_outputs).super_VectorView<unsigned_int>.ptr;
      lVar23 = 0;
      do {
        uVar12 = *(uint *)((long)puVar6 + lVar23);
        pSVar13 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + uVar12);
        CompilerGLSL::add_local_variable_name(&this->super_CompilerGLSL,uVar12);
        CompilerGLSL::variable_decl_abi_cxx11_(&name,&this->super_CompilerGLSL,pSVar13);
        CompilerGLSL::statement<std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&name,(char (*) [2])0x405f81);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p);
        }
        pSVar13->deferred_declaration = false;
        lVar23 = lVar23 + 4;
      } while (sVar5 << 2 != lVar23);
    }
  }
  return;
}

Assistant:

void CompilerMSL::emit_entry_point_declarations()
{
	// FIXME: Get test coverage here ...
	// Constant arrays of non-primitive types (i.e. matrices) won't link properly into Metal libraries
	declare_complex_constant_arrays();

	// Emit constexpr samplers here.
	for (auto &samp : constexpr_samplers_by_id)
	{
		auto &var = get<SPIRVariable>(samp.first);
		auto &type = get<SPIRType>(var.basetype);
		if (type.basetype == SPIRType::Sampler)
			add_resource_name(samp.first);

		SmallVector<string> args;
		auto &s = samp.second;

		if (s.coord != MSL_SAMPLER_COORD_NORMALIZED)
			args.push_back("coord::pixel");

		if (s.min_filter == s.mag_filter)
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("filter::linear");
		}
		else
		{
			if (s.min_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("min_filter::linear");
			if (s.mag_filter != MSL_SAMPLER_FILTER_NEAREST)
				args.push_back("mag_filter::linear");
		}

		switch (s.mip_filter)
		{
		case MSL_SAMPLER_MIP_FILTER_NONE:
			// Default
			break;
		case MSL_SAMPLER_MIP_FILTER_NEAREST:
			args.push_back("mip_filter::nearest");
			break;
		case MSL_SAMPLER_MIP_FILTER_LINEAR:
			args.push_back("mip_filter::linear");
			break;
		default:
			SPIRV_CROSS_THROW("Invalid mip filter.");
		}

		if (s.s_address == s.t_address && s.s_address == s.r_address)
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("", s.s_address));
		}
		else
		{
			if (s.s_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("s_", s.s_address));
			if (s.t_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("t_", s.t_address));
			if (s.r_address != MSL_SAMPLER_ADDRESS_CLAMP_TO_EDGE)
				args.push_back(create_sampler_address("r_", s.r_address));
		}

		if (s.compare_enable)
		{
			switch (s.compare_func)
			{
			case MSL_SAMPLER_COMPARE_FUNC_ALWAYS:
				args.push_back("compare_func::always");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NEVER:
				args.push_back("compare_func::never");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_EQUAL:
				args.push_back("compare_func::equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_NOT_EQUAL:
				args.push_back("compare_func::not_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS:
				args.push_back("compare_func::less");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_LESS_EQUAL:
				args.push_back("compare_func::less_equal");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER:
				args.push_back("compare_func::greater");
				break;
			case MSL_SAMPLER_COMPARE_FUNC_GREATER_EQUAL:
				args.push_back("compare_func::greater_equal");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler compare function.");
			}
		}

		if (s.s_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER || s.t_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER ||
		    s.r_address == MSL_SAMPLER_ADDRESS_CLAMP_TO_BORDER)
		{
			switch (s.border_color)
			{
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_BLACK:
				args.push_back("border_color::opaque_black");
				break;
			case MSL_SAMPLER_BORDER_COLOR_OPAQUE_WHITE:
				args.push_back("border_color::opaque_white");
				break;
			case MSL_SAMPLER_BORDER_COLOR_TRANSPARENT_BLACK:
				args.push_back("border_color::transparent_black");
				break;
			default:
				SPIRV_CROSS_THROW("Invalid sampler border color.");
			}
		}

		if (s.anisotropy_enable)
			args.push_back(join("max_anisotropy(", s.max_anisotropy, ")"));
		if (s.lod_clamp_enable)
		{
			args.push_back(join("lod_clamp(", format_float(s.lod_clamp_min), ", ", format_float(s.lod_clamp_max), ")"));
		}

		// If we would emit no arguments, then omit the parentheses entirely. Otherwise,
		// we'll wind up with a "most vexing parse" situation.
		if (args.empty())
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          ";");
		else
			statement("constexpr sampler ",
			          type.basetype == SPIRType::SampledImage ? to_sampler_expression(samp.first) : to_name(samp.first),
			          "(", merge(args), ");");
	}

	// Emit dynamic buffers here.
	for (auto &dynamic_buffer : buffers_requiring_dynamic_offset)
	{
		if (!dynamic_buffer.second.second)
		{
			// Could happen if no buffer was used at requested binding point.
			continue;
		}

		const auto &var = get<SPIRVariable>(dynamic_buffer.second.second);
		uint32_t var_id = var.self;
		const auto &type = get_variable_data_type(var);
		string name = to_name(var.self);
		uint32_t desc_set = get_decoration(var.self, DecorationDescriptorSet);
		uint32_t arg_id = argument_buffer_ids[desc_set];
		uint32_t base_index = dynamic_buffer.second.first;

		if (is_array(type))
		{
			is_using_builtin_array = true;
			statement(get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, true), name,
			          type_to_array_glsl(type, var_id), " =");

			uint32_t array_size = get_resource_array_size(type, var_id);
			if (array_size == 0)
				SPIRV_CROSS_THROW("Size of runtime array with dynamic offset could not be determined from resource bindings.");

			begin_scope();

			for (uint32_t i = 0; i < array_size; i++)
			{
				statement("(", get_argument_address_space(var), " ", type_to_glsl(type), "* ",
				          to_restrict(var_id, false), ")((", get_argument_address_space(var), " char* ",
				          to_restrict(var_id, false), ")", to_name(arg_id), ".", ensure_valid_name(name, "m"),
				          "[", i, "]", " + ", to_name(dynamic_offsets_buffer_id), "[", base_index + i, "]),");
			}

			end_scope_decl();
			statement_no_indent("");
			is_using_builtin_array = false;
		}
		else
		{
			statement(get_argument_address_space(var), " auto& ", to_restrict(var_id, true), name, " = *(",
			          get_argument_address_space(var), " ", type_to_glsl(type), "* ", to_restrict(var_id, false), ")((",
			          get_argument_address_space(var), " char* ", to_restrict(var_id, false), ")", to_name(arg_id), ".",
			          ensure_valid_name(name, "m"), " + ", to_name(dynamic_offsets_buffer_id), "[", base_index, "]);");
		}
	}

	bool has_runtime_array_declaration = false;
	for (SPIRVariable *arg : entry_point_bindings)
	{
		const auto &var = *arg;
		const auto &type = get_variable_data_type(var);
		const auto &buffer_type = get_variable_element_type(var);
		const string name = to_name(var.self);

		if (is_var_runtime_size_array(var))
		{
			if (msl_options.argument_buffers_tier < Options::ArgumentBuffersTier::Tier2)
			{
				SPIRV_CROSS_THROW("Unsized array of descriptors requires argument buffer tier 2");
			}

			string resource_name;
			if (descriptor_set_is_argument_buffer(get_decoration(var.self, DecorationDescriptorSet)))
				resource_name = ir.meta[var.self].decoration.qualified_alias;
			else
				resource_name = name + "_";

			switch (type.basetype)
			{
			case SPIRType::Image:
			case SPIRType::Sampler:
			case SPIRType::AccelerationStructure:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				break;
			case SPIRType::SampledImage:
				statement("spvDescriptorArray<", type_to_glsl(buffer_type, var.self), "> ", name, " {", resource_name, "};");
				// Unsupported with argument buffer for now.
				statement("spvDescriptorArray<sampler> ", name, "Smplr {", name, "Smplr_};");
				break;
			case SPIRType::Struct:
				statement("spvDescriptorArray<", get_argument_address_space(var), " ", type_to_glsl(buffer_type), "*> ",
				          name, " {", resource_name, "};");
				break;
			default:
				break;
			}
			has_runtime_array_declaration = true;
		}
		else if (!type.array.empty() && type.basetype == SPIRType::Struct)
		{
			// Emit only buffer arrays here.
			statement(get_argument_address_space(var), " ", type_to_glsl(buffer_type), "* ",
			          to_restrict(var.self, true), name, "[] =");
			begin_scope();
			uint32_t array_size = get_resource_array_size(type, var.self);
			for (uint32_t i = 0; i < array_size; ++i)
				statement(name, "_", i, ",");
			end_scope_decl();
			statement_no_indent("");
		}
	}

	if (has_runtime_array_declaration)
		statement_no_indent("");

	// Emit buffer aliases here.
	for (auto &var_id : buffer_aliases_discrete)
	{
		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);
		auto name = to_name(var_id);

		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		uint32_t desc_binding = get_decoration(var_id, DecorationBinding);
		auto alias_name = join("spvBufferAliasSet", desc_set, "Binding", desc_binding);

		statement(addr_space, " auto& ", to_restrict(var_id, true),
		          name,
		          " = *(", addr_space, " ", type_to_glsl(type), "*)", alias_name, ";");
	}
	// Discrete descriptors are processed in entry point emission every compiler iteration.
	buffer_aliases_discrete.clear();

	for (auto &var_pair : buffer_aliases_argument)
	{
		uint32_t var_id = var_pair.first;
		uint32_t alias_id = var_pair.second;

		const auto &var = get<SPIRVariable>(var_id);
		const auto &type = get_variable_data_type(var);
		auto addr_space = get_argument_address_space(var);

		if (type.array.empty())
		{
			statement(addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "&)", ir.meta[alias_id].decoration.qualified_alias, ";");
		}
		else
		{
			const char *desc_addr_space = descriptor_address_space(var_id, var.storage, "thread");

			// Esoteric type cast. Reference to array of pointers.
			// Auto here defers to UBO or SSBO. The address space of the reference needs to refer to the
			// address space of the argument buffer itself, which is usually constant, but can be const device for
			// large argument buffers.
			is_using_builtin_array = true;
			statement(desc_addr_space, " auto& ", to_restrict(var_id, true), to_name(var_id), " = (", addr_space, " ",
			          type_to_glsl(type), "* ", desc_addr_space, " (&)",
			          type_to_array_glsl(type, var_id), ")", ir.meta[alias_id].decoration.qualified_alias, ";");
			is_using_builtin_array = false;
		}
	}

	// Emit disabled fragment outputs.
	std::sort(disabled_frag_outputs.begin(), disabled_frag_outputs.end());
	for (uint32_t var_id : disabled_frag_outputs)
	{
		auto &var = get<SPIRVariable>(var_id);
		add_local_variable_name(var_id);
		statement(CompilerGLSL::variable_decl(var), ";");
		var.deferred_declaration = false;
	}
}